

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIFileOpenDialog::draw(CGUIFileOpenDialog *this)

{
  undefined4 uVar1;
  int iVar2;
  long *plVar3;
  undefined8 *puVar4;
  rect<int> rect;
  undefined1 local_68 [16];
  string<wchar_t> local_50;
  
  if (this->field_0xa0 == '\x01') {
    plVar3 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
    local_68._0_8_ = *(undefined8 *)&this->field_0x40;
    local_68._8_8_ = *(undefined8 *)&this->field_0x48;
    uVar1 = (**(code **)*plVar3)(plVar3,5);
    local_68 = (**(code **)(*plVar3 + 0x78))(plVar3,this,1,uVar1,local_68,&this->field_0x50,0);
    if (*(int *)&this->field_0xb0 != 0) {
      local_68._0_4_ = local_68._0_4_ + 2;
      iVar2 = (**(code **)(*plVar3 + 0x10))(plVar3,2);
      local_68._8_4_ = (local_68._8_4_ - iVar2) + -5;
      puVar4 = (undefined8 *)(**(code **)(*plVar3 + 0x30))(plVar3,2);
      if (puVar4 != (undefined8 *)0x0) {
        core::string<wchar_t>::string<wchar_t>(&local_50,*(wchar_t **)&this->field_0xa8);
        uVar1 = (**(code **)*plVar3)(plVar3,6);
        (**(code **)*puVar4)(puVar4,&local_50,local_68,uVar1,0,1,&this->field_0x50);
        ::std::__cxx11::wstring::_M_dispose();
      }
    }
    IGUIElement::draw((IGUIElement *)this);
  }
  return;
}

Assistant:

void CGUIFileOpenDialog::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();

	core::rect<s32> rect = AbsoluteRect;

	rect = skin->draw3DWindowBackground(this, true, skin->getColor(EGDC_ACTIVE_BORDER),
			rect, &AbsoluteClippingRect);

	if (Text.size()) {
		rect.UpperLeftCorner.X += 2;
		rect.LowerRightCorner.X -= skin->getSize(EGDS_WINDOW_BUTTON_WIDTH) + 5;

		IGUIFont *font = skin->getFont(EGDF_WINDOW);
		if (font)
			font->draw(Text.c_str(), rect,
					skin->getColor(EGDC_ACTIVE_CAPTION),
					false, true, &AbsoluteClippingRect);
	}

	IGUIElement::draw();
}